

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_state_command_resp(connectdata *conn,int pop3code,pop3state instate)

{
  SessionHandle *pSVar1;
  int *piVar2;
  anon_union_224_10_26c073a1_for_proto *paVar3;
  pingpong *pp;
  pop3_conn *pop3c;
  POP3 *pop3;
  SessionHandle *data;
  CURLcode result;
  pop3state instate_local;
  int pop3code_local;
  connectdata *conn_local;
  
  data._4_4_ = CURLE_OK;
  pSVar1 = conn->data;
  piVar2 = (int *)(pSVar1->req).protop;
  paVar3 = &conn->proto;
  if (pop3code == 0x2b) {
    (conn->proto).pop3c.eob = 2;
    (conn->proto).pop3c.strip = 2;
    if ((*piVar2 == 0) &&
       (Curl_setup_transfer(conn,0,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0),
       (paVar3->ftpc).pp.cache != (char *)0x0)) {
      if ((((pSVar1->set).opt_no_body & 1U) == 0) &&
         (data._4_4_ = Curl_pop3_write(conn,(paVar3->ftpc).pp.cache,(conn->proto).rtspc.rtp_bufsize)
         , data._4_4_ != CURLE_OK)) {
        return data._4_4_;
      }
      (*Curl_cfree)((paVar3->ftpc).pp.cache);
      (paVar3->ftpc).pp.cache = (char *)0x0;
      (conn->proto).ftpc.pp.cache_size = 0;
    }
    state(conn,POP3_STOP);
    conn_local._4_4_ = data._4_4_;
  }
  else {
    state(conn,POP3_STOP);
    conn_local._4_4_ = CURLE_RECV_ERROR;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode pop3_state_command_resp(struct connectdata *conn,
                                        int pop3code,
                                        pop3state instate)
{
  CURLcode result = CURLE_OK;
  struct SessionHandle *data = conn->data;
  struct POP3 *pop3 = data->req.protop;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  struct pingpong *pp = &pop3c->pp;

  (void)instate; /* no use for this yet */

  if(pop3code != '+') {
    state(conn, POP3_STOP);
    return CURLE_RECV_ERROR;
  }

  /* This 'OK' line ends with a CR LF pair which is the two first bytes of the
     EOB string so count this is two matching bytes. This is necessary to make
     the code detect the EOB if the only data than comes now is %2e CR LF like
     when there is no body to return. */
  pop3c->eob = 2;

  /* But since this initial CR LF pair is not part of the actual body, we set
     the strip counter here so that these bytes won't be delivered. */
  pop3c->strip = 2;

  if(pop3->transfer == FTPTRANSFER_BODY) {
    /* POP3 download */
    Curl_setup_transfer(conn, FIRSTSOCKET, -1, FALSE, NULL, -1, NULL);

    if(pp->cache) {
      /* The header "cache" contains a bunch of data that is actually body
         content so send it as such. Note that there may even be additional
         "headers" after the body */

      if(!data->set.opt_no_body) {
        result = Curl_pop3_write(conn, pp->cache, pp->cache_size);
        if(result)
          return result;
      }

      /* Free the cache */
      Curl_safefree(pp->cache);

      /* Reset the cache size */
      pp->cache_size = 0;
    }
  }

  /* End of DO phase */
  state(conn, POP3_STOP);

  return result;
}